

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Config * __thiscall Catch::Session::config(Session *this)

{
  bool bVar1;
  Config *pCVar2;
  Config *in_RDI;
  Ptr<Catch::Config> *unaff_retaddr;
  ConfigData *in_stack_000000a8;
  Config *in_stack_000000b0;
  
  pCVar2 = in_RDI;
  bVar1 = Ptr<Catch::Config>::operator!((Ptr<Catch::Config> *)&in_RDI[1].m_data.field_0x40);
  if (bVar1) {
    operator_new(0xe8);
    Config::Config(in_stack_000000b0,in_stack_000000a8);
    Ptr<Catch::Config>::operator=(unaff_retaddr,pCVar2);
  }
  pCVar2 = Ptr<Catch::Config>::operator*((Ptr<Catch::Config> *)&in_RDI[1].m_data.field_0x40);
  return pCVar2;
}

Assistant:

Config& config() {
            if( !m_config )
                m_config = new Config( m_configData );
            return *m_config;
        }